

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::handleFtpCommandFEAT(FtpSession *this,string *param_1)

{
  stringstream ss;
  string sStack_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_198);
  ::std::operator<<(local_188,"211- Feature List:\r\n");
  ::std::operator<<(local_188," UTF8\r\n");
  ::std::operator<<(local_188," SIZE\r\n");
  ::std::operator<<(local_188," LANG EN\r\n");
  ::std::operator<<(local_188,"211 END\r\n");
  ::std::__cxx11::stringbuf::str();
  sendRawFtpMessage(this,&sStack_1b8);
  ::std::__cxx11::string::~string((string *)&sStack_1b8);
  ::std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void FtpSession::handleFtpCommandFEAT(const std::string& /*param*/)
  {
    std::stringstream ss;
    ss << "211- Feature List:\r\n";
    ss << " UTF8\r\n";
    ss << " SIZE\r\n";
    ss << " LANG EN\r\n";
    ss << "211 END\r\n";

    sendRawFtpMessage(ss.str());
  }